

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QSizeF *sz)

{
  long in_FS_OFFSET;
  double h;
  double w;
  double local_38;
  double local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = -NAN;
  local_38 = -NAN;
  QDataStream::operator>>(s,&local_30);
  QDataStream::operator>>(s,&local_38);
  sz->wd = local_30;
  sz->ht = local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QSizeF &sz)
{
    double w, h;
    s >> w;
    s >> h;
    sz.setWidth(qreal(w));
    sz.setHeight(qreal(h));
    return s;
}